

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1EnforceMaxPage(PGroup *pGroup)

{
  PgHdr1 *pPage;
  bool bVar1;
  PgHdr1 *p;
  PGroup *pGroup_local;
  
  while( true ) {
    bVar1 = false;
    if (pGroup->nMaxPage < pGroup->nCurrentPage) {
      bVar1 = pGroup->pLruTail != (PgHdr1 *)0x0;
    }
    if (!bVar1) break;
    pPage = pGroup->pLruTail;
    pcache1PinPage(pPage);
    pcache1RemoveFromHash(pPage);
    pcache1FreePage(pPage);
  }
  return;
}

Assistant:

static void pcache1EnforceMaxPage(PGroup *pGroup){
  assert( sqlite3_mutex_held(pGroup->mutex) );
  while( pGroup->nCurrentPage>pGroup->nMaxPage && pGroup->pLruTail ){
    PgHdr1 *p = pGroup->pLruTail;
    assert( p->pCache->pGroup==pGroup );
    pcache1PinPage(p);
    pcache1RemoveFromHash(p);
    pcache1FreePage(p);
  }
}